

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

void __thiscall BanMan::~BanMan(BanMan *this)

{
  long lVar1;
  CBanDB *in_RDI;
  long in_FS_OFFSET;
  BanMan *in_stack_00000068;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DumpBanlist(in_stack_00000068);
  CRollingBloomFilter::~CRollingBloomFilter((CRollingBloomFilter *)in_RDI);
  CBanDB::~CBanDB(in_RDI);
  std::
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::~map((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
          *)in_RDI);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin((AnnotatedMixin<std::mutex> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BanMan::~BanMan()
{
    DumpBanlist();
}